

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

void __thiscall calculator::Lexer::Lexer(Lexer *this)

{
  long lVar1;
  anon_class_1_0_00000001 local_444;
  undefined1 local_443;
  undefined1 local_442;
  anon_class_1_0_00000001 local_441 [16];
  undefined1 local_431;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>
  local_430 [3];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  local_70;
  
  (this->constant)._M_h._M_buckets = &(this->constant)._M_h._M_single_bucket;
  (this->constant)._M_h._M_bucket_count = 1;
  (this->constant)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->constant)._M_h._M_element_count = 0;
  (this->constant)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->constant)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->constant)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->variable)._M_h._M_buckets = &(this->variable)._M_h._M_single_bucket;
  (this->variable)._M_h._M_bucket_count = 1;
  (this->variable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variable)._M_h._M_element_count = 0;
  (this->variable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variable)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[5],_double_(&)(double)_noexcept,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
              *)local_430,(char (*) [5])"sqrt",sqrtf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[5],_double_(&)(double)_noexcept,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
              *)(local_430 + 1),(char (*) [5])"ceil",ceilf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[4],_double_(&)(double)_noexcept,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
              *)(local_430 + 2),(char (*) [4])0x10ed2d,cosf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[4],_double_(&)(double)_noexcept,_true>
            (&local_370,(char (*) [4])0x10ed32,sinf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[4],_double_(&)(double)_noexcept,_true>
            (&local_330,(char (*) [4])0x10ed37,tanf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[4],_double_(&)(double)_noexcept,_true>
            (&local_2f0,(char (*) [4])"log",logf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[6],_double_(&)(double)_noexcept,_true>
            (&local_2b0,(char (*) [6])"floor",floorf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[5],_double_(&)(double)_noexcept,_true>
            (&local_270,(char (*) [5])"acos",acosf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[5],_double_(&)(double)_noexcept,_true>
            (&local_230,(char (*) [5])"asin",asinf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[5],_double_(&)(double)_noexcept,_true>
            (&local_1f0,(char (*) [5])"atan",atanf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[4],_double_(&)(double)_noexcept,_true>
            (&local_1b0,(char (*) [4])"exp",expf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[5],_double_(&)(double)_noexcept,_true>
            (&local_170,(char (*) [5])"log2",log2f64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[6],_double_(&)(double)_noexcept,_true>
            (&local_130,(char (*) [6])"log10",log10f64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[4],_double_(&)(double)_noexcept,_true>(&local_f0,(char (*) [4])"erf",erff64)
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::pair<const_char_(&)[6],_double_(&)(double)_noexcept,_true>
            (&local_b0,(char (*) [6])"round",roundf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
  ::
  pair<const_char_(&)[10],_calculator::Lexer::(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_josexy[P]MyEasyCalculator_Calculator_src____include_Lexer_h:39:23),_true>
            (&local_70,(char (*) [10])"factorial",&local_444);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<double(double)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<double(double)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::function<double(double)>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<double(double)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<double(double)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->unary_functions,local_430,&stack0xffffffffffffffd0,0,local_441,&local_442,
             &local_443);
  lVar1 = 0x3c0;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>
             *)((long)&local_430[0].first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>
  ::pair<const_char_(&)[4],_double_(&)(double,_double)_noexcept,_true>
            (local_430,(char (*) [4])"pow",powf64);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>
  ::
  pair<const_char_(&)[4],_calculator::Lexer::(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_josexy[P]MyEasyCalculator_Calculator_src____include_Lexer_h:47:17),_true>
            (local_430 + 1,(char (*) [4])"max",&local_444);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>
  ::
  pair<const_char_(&)[4],_calculator::Lexer::(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_josexy[P]MyEasyCalculator_Calculator_src____include_Lexer_h:48:17),_true>
            (local_430 + 2,(char (*) [4])"min",local_441);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<double(double,double)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<double(double,double)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::function<double(double,double)>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<double(double,double)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<double(double,double)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->binary_functions,local_430,&local_370,0,&local_442,&local_443,&local_431);
  lVar1 = 0x80;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>
             *)((long)&local_430[0].first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  this->line_ = 0;
  this->lookforward_ = '\0';
  this->is_function_ = false;
  (this->reader_).sbuffer_ = (char *)0x0;
  (this->reader_).ptr_ = -1;
  *(undefined8 *)&(this->reader_).len_ = 0;
  *(undefined8 *)
   ((long)&(this->tokenlist_).
           super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->tokenlist_).
  super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokenlist_).
  super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>(&this->bracket_match_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)this);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->variable)._M_h);
  std::
  vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>::
  clear(&this->tokenlist_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_430,"pi",(allocator<char> *)&local_444);
  putConstant(this,&local_430[0].first,3.141592653589793);
  std::__cxx11::string::~string((string *)local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_430,"e",(allocator<char> *)&local_444);
  putConstant(this,&local_430[0].first,2.718281828459045);
  std::__cxx11::string::~string((string *)local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_430,"sqrt2",(allocator<char> *)&local_444);
  putConstant(this,&local_430[0].first,1.4142135623730951);
  std::__cxx11::string::~string((string *)local_430);
  return;
}

Assistant:

Lexer::Lexer() : line_(0), lookforward_(0), is_function_(false) {
    constant.clear();
    variable.clear();
    tokenlist_.clear();

    putConstant("pi", 3.141592653589793);
    putConstant("e", 2.718281828459045);
    putConstant("sqrt2", 1.4142135623730951);
}